

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wood.cpp
# Opt level: O0

void __thiscall Wood::apply(Wood *this,Vector *p,SurfaceData *t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Vector local_b0;
  Vector local_98;
  Vector local_80;
  Vector local_68;
  Vector local_50;
  double local_38;
  double s;
  double y;
  double x;
  SurfaceData *t_local;
  Vector *p_local;
  Wood *this_local;
  
  y = p->x * (this->super_Texture).scale.x + (this->super_Texture).offs.x;
  s = p->y * (this->super_Texture).scale.y + (this->super_Texture).offs.y;
  dVar4 = this->ring_spacing;
  x = (double)t;
  t_local = (SurfaceData *)p;
  p_local = (Vector *)this;
  dVar2 = sqrt(y * y + s * s);
  dVar1 = (this->super_Texture).turb;
  dVar3 = turbulence((Vector *)t_local,(this->super_Texture).octaves);
  dVar4 = sineWave(dVar4 * dVar2 + dVar1 * dVar3);
  local_38 = std::pow<double,int>(dVar4,this->squeeze);
  Vector::Vector(&local_80,0.6,0.24,0.1);
  operator*(&local_68,&local_80,1.0 - local_38);
  Vector::Vector(&local_b0,0.05,0.01,0.005);
  operator*(&local_98,&local_b0,local_38);
  operator+(&local_50,&local_68,&local_98);
  Vector::operator=((Vector *)((long)x + 0x28),&local_50);
  *(double *)((long)x + 0x10) = (local_38 * 0.3 + 0.7) * *(double *)((long)x + 0x10);
  return;
}

Assistant:

void Wood::apply( Vector& p, Grayzer::SurfaceData& t )
{
   double x = p.x * scale.x + offs.x;
   double y = p.y * scale.y + offs.y;
   double s = pow(   sineWave( ring_spacing * sqrt(  x *   x +   y *   y )   +
            turb  * turbulence(p,   octaves) ), squeeze  );

   t.color  = LightWood * (1 - s) + DarkWood * s;
   t.ks *=  0.3   * s   + 0.7;
}